

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O1

void __thiscall
TPZSYsmpMatrix<double>::AutoFill
          (TPZSYsmpMatrix<double> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  set<long,_std::less<long>,_std::allocator<long>_> *psVar4;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  _Self __tmp;
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_> eqs;
  TPZVec<long> IA;
  TPZStack<long,_10> JA;
  TPZStack<double,_10> A;
  long local_200;
  long local_1f8;
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_> local_1f0;
  TPZSYsmpMatrix<double> *local_1d0;
  int64_t local_1c8;
  TPZVec<long> local_1c0;
  TPZFMatrix<double> local_1a0;
  TPZManVector<long,_10> local_110;
  TPZManVector<double,_10> local_a0;
  
  if (nrow != ncol || symmetric == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzsysmp.cpp"
               ,0x120);
  }
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_1a0.fElem = (double *)0x0;
  local_1a0.fGiven = (double *)0x0;
  local_1a0.fSize = 0;
  TPZVec<int>::TPZVec(&local_1a0.fPivot.super_TPZVec<int>,0);
  local_1a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1a0.fPivot.super_TPZVec<int>.fStore = local_1a0.fPivot.fExtAlloc;
  local_1a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1a0.fWork.fStore = (double *)0x0;
  local_1a0.fWork.fNElements = 0;
  local_1a0.fWork.fNAlloc = 0;
  TPZMatrix<double>::AutoFill(&local_1a0.super_TPZMatrix<double>,nrow,ncol,symmetric);
  TPZVec<long>::TPZVec(&local_1c0,nrow + 1);
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_110);
  TPZStack<double,_10>::TPZStack((TPZStack<double,_10> *)&local_a0);
  *local_1c0.fStore = 0;
  local_1d0 = this;
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_>::TPZVec(&local_1f0,nrow);
  local_1f8 = 0;
  if (0 < nrow) {
    do {
      std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 (local_1f0.fStore + local_1f8),&local_1f8);
      local_200 = 0;
      if (0 < ncol) {
        do {
          iVar3 = rand();
          if (0.5 < (double)iVar3 / 2147483647.0) {
            std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
            _M_insert_unique<long_const&>
                      ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                        *)(local_1f0.fStore + local_1f8),&local_200);
            if (symmetric != 0) {
              std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
              _M_insert_unique<long_const&>
                        ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                          *)(local_1f0.fStore + local_200),&local_1f8);
            }
          }
          local_200 = local_200 + 1;
        } while (local_200 < ncol);
      }
      local_1f8 = local_1f8 + 1;
    } while (local_1f8 < nrow);
  }
  if (0 < nrow) {
    lVar6 = 0;
    local_1c8 = nrow;
    do {
      psVar4 = local_1f0.fStore + lVar6;
      p_Var5 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)p_Var5 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header) {
        if (lVar6 <= *(long *)(p_Var5 + 1)) {
          TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_110,*(long *)(p_Var5 + 1));
          lVar1 = *(long *)(p_Var5 + 1);
          if (((local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) || (lVar1 < 0))
             || (local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          TPZStack<double,_10>::Push
                    ((TPZStack<double,_10> *)&local_a0,
                     local_1a0.fElem
                     [lVar1 * local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar6]);
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        psVar4 = local_1f0.fStore + lVar6;
      }
      local_1c0.fStore[lVar6 + 1] = local_110.super_TPZVec<long>.fNElements;
      lVar6 = lVar6 + 1;
      nrow = local_1c8;
    } while (lVar6 != local_1c8);
  }
  (local_1d0->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = nrow;
  (local_1d0->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = ncol;
  (*(local_1d0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x4f]
  )(local_1d0,&local_1c0,&local_110,&local_a0);
  local_1f0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0187f638;
  if (local_1f0.fStore != (set<long,_std::less<long>,_std::allocator<long>_> *)0x0) {
    sVar2 = local_1f0.fStore[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (sVar2 != 0) {
      lVar6 = sVar2 * 0x30;
      do {
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                   *)(&local_1f0.fStore[-1]._M_t._M_impl.field_0x0 + lVar6));
        lVar6 = lVar6 + -0x30;
      } while (lVar6 != 0);
    }
    operator_delete__(&local_1f0.fStore[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      sVar2 * 0x30 + 8);
  }
  TPZManVector<double,_10>::~TPZManVector(&local_a0);
  TPZManVector<long,_10>::~TPZManVector(&local_110);
  local_1c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_1c0.fStore != (long *)0x0) {
    operator_delete__(local_1c0.fStore);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_1a0);
  return;
}

Assistant:

void TPZSYsmpMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric)
{
    if (!symmetric || nrow != ncol) {
        DebugStop();
    }
    TPZFMatrix<TVar> orig;
    orig.AutoFill(nrow,ncol,symmetric);
    
    TPZVec<int64_t> IA(nrow+1);
    TPZStack<int64_t> JA;
    TPZStack<TVar> A;
    IA[0] = 0;
    TPZVec<std::set<int64_t> > eqs(nrow);
    for (int64_t row=0; row<nrow; row++) {
        eqs[row].insert(row);
        for (int64_t col = 0; col<ncol; col++) {
            REAL test = rand()*1./RAND_MAX;
            if (test > 0.5) {
                eqs[row].insert(col);
                if (symmetric) {
                    eqs[col].insert(row);
                }
            }
        }
    }
    int64_t pos=0;
    for (int64_t row=0; row< nrow; row++) {
        for (std::set<int64_t>::iterator col = eqs[row].begin(); col != eqs[row].end(); col++) {
            if(*col >= row)
            {
                JA.Push(*col);
                A.Push(orig(row,*col));
            }
        }
        IA[row+1] = JA.size();
    }
    TPZMatrix<TVar>::Resize(nrow,ncol);
    SetData(IA, JA, A);
}